

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_asof_join.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::PlanAsOfJoin(PhysicalPlanGenerator *this,LogicalComparisonJoin *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  vector<duckdb::JoinCondition,_true> *this_02;
  vector<unsigned_long,_true> *this_03;
  ExpressionType EVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  pointer puVar3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar4;
  pointer puVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  pointer pLVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  type pLVar10;
  PhysicalOperator *pPVar11;
  PhysicalOperator *build;
  reference pvVar12;
  ClientConfig *pCVar13;
  pointer pEVar14;
  pointer pBVar15;
  reference pvVar16;
  PhysicalOperator *pPVar17;
  InternalException *pIVar18;
  pointer pJVar19;
  pointer pJVar20;
  pointer puVar21;
  size_type sVar22;
  size_type sVar23;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var24;
  _Head_base<0UL,_duckdb::BoundWindowExpression_*,_false> local_130;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  window_select;
  optional_ptr<duckdb::PhysicalOperator,_true> result;
  JoinCondition asof_upper;
  LogicalType asof_type;
  unsigned_long local_60;
  idx_t rhs_cardinality;
  idx_t lhs_cardinality;
  vector<unsigned_long,_true> equi_indexes;
  
  this_00 = &(op->super_LogicalJoin).super_LogicalOperator.children;
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar8);
  iVar6 = (*pLVar9->_vptr_LogicalOperator[7])(pLVar9,this->context);
  lhs_cardinality = CONCAT44(extraout_var,iVar6);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,1);
  pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar8);
  iVar7 = (*pLVar9->_vptr_LogicalOperator[7])(pLVar9);
  rhs_cardinality = CONCAT44(extraout_var_00,iVar7);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(pvVar8);
  pPVar11 = CreatePlan(this,pLVar10);
  pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,1);
  pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(pvVar8);
  build = CreatePlan(this,pLVar10);
  equi_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  equi_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  equi_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this_02 = &op->conditions;
  pJVar20 = (op->conditions).
            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
            super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pJVar19 = (op->conditions).
            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
            super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  sVar22 = ((long)pJVar19 - (long)pJVar20) / 0x18;
  for (asof_type._0_8_ = 0; (ulong)asof_type._0_8_ < (ulong)(((long)pJVar19 - (long)pJVar20) / 0x18)
      ; asof_type._0_8_ = asof_type._0_8_ + 1) {
    pvVar12 = vector<duckdb::JoinCondition,_true>::get<true>(this_02,asof_type._0_8_);
    EVar1 = pvVar12->comparison;
    sVar23 = asof_type._0_8_;
    if (3 < EVar1 - 0x1b) {
      if ((EVar1 != COMPARE_BOUNDARY_START) && (EVar1 != COMPARE_BOUNDARY_END)) {
        pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&result,"Invalid ASOF JOIN comparison",(allocator *)&window_select);
        InternalException::InternalException(pIVar18,(string *)&result);
        __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&equi_indexes,
                 (unsigned_long *)&asof_type);
      sVar23 = sVar22;
    }
    pJVar20 = (op->conditions).
              super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
              super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pJVar19 = (op->conditions).
              super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
              super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    sVar22 = sVar23;
  }
  pCVar13 = ClientConfig::GetConfig(this->context);
  if (pCVar13->force_asof_iejoin == false) {
    pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(this_00,0);
    pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar8);
    if (((pLVar9->has_estimated_cardinality == true) &&
        (CONCAT44(extraout_var,iVar6) <= pCVar13->asof_loop_join_threshold)) &&
       (result = PlanAsOfLoopJoin(this,op,pPVar11,build), result.ptr != (PhysicalOperator *)0x0)) {
      pPVar11 = optional_ptr<duckdb::PhysicalOperator,_true>::operator*(&result);
    }
    else {
      pPVar11 = Make<duckdb::PhysicalAsOfJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&>
                          (this,op,pPVar11,build);
    }
  }
  else {
    if ((op->super_LogicalJoin).right_projection_map.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (op->super_LogicalJoin).right_projection_map.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_03 = &(op->super_LogicalJoin).right_projection_map;
      pPVar17 = (PhysicalOperator *)
                (((long)(build->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(build->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (&this_03->super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                 (size_type)pPVar17);
      for (result.ptr = (PhysicalOperator *)0x0; result.ptr < pPVar17;
          result.ptr = (PhysicalOperator *)((long)&(result.ptr)->_vptr_PhysicalOperator + 1)) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_03,
                   (unsigned_long *)&result);
      }
    }
    pvVar12 = vector<duckdb::JoinCondition,_true>::get<true>(this_02,sVar22);
    this_01 = &pvVar12->right;
    pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_01);
    LogicalType::LogicalType(&asof_type,&pEVar14->return_type);
    asof_upper.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = 0x84;
    result.ptr = (PhysicalOperator *)0x0;
    window_select.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalType&,decltype(nullptr),decltype(nullptr)>
              ((ExpressionType *)&local_130,(LogicalType *)&asof_upper,(void **)&asof_type,
               &result.ptr);
    pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_130);
    pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_01);
    (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])(&result,pEVar14);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar15->children,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &result);
    if (result.ptr != (PhysicalOperator *)0x0) {
      (*(result.ptr)->_vptr_PhysicalOperator[1])();
    }
    Value::BIGINT((Value *)&result,1);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
              ((duckdb *)&window_select,(Value *)&result);
    puVar3 = window_select.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    window_select.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_130);
    _Var24._M_head_impl =
         (pBVar15->offset_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar15->offset_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)puVar3;
    if (_Var24._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var24._M_head_impl)->super_BaseExpression + 8))();
    }
    if (window_select.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((window_select.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    window_select.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Value::~Value((Value *)&result);
    puVar5 = equi_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar21 = equi_indexes.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar21 != puVar5; puVar21 = puVar21 + 1) {
      sVar22 = *puVar21;
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_130);
      pvVar16 = vector<duckdb::JoinCondition,_true>::get<true>(this_02,sVar22);
      pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&pvVar16->right);
      (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])((Value *)&result,pEVar14);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar15->partitions,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &result);
      if (result.ptr != (PhysicalOperator *)0x0) {
        (*(result.ptr)->_vptr_PhysicalOperator[1])();
      }
    }
    switch(pvVar12->comparison) {
    case COMPARE_LESSTHAN:
    case COMPARE_LESSTHANOREQUALTO:
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_130);
      window_select.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(window_select.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,3);
      asof_upper.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
      ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = 2;
      pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_01);
      (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])(&result,pEVar14);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar15->orders,(OrderType *)&window_select,(OrderByNullType *)&asof_upper,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &result);
      if (result.ptr != (PhysicalOperator *)0x0) {
        (*(result.ptr)->_vptr_PhysicalOperator[1])();
      }
      Value::NegativeInfinity((Value *)&result,&asof_type);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                ((duckdb *)&window_select,(Value *)&result);
      _Var24._M_head_impl =
           (Expression *)
           window_select.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      window_select.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_130);
      break;
    case COMPARE_GREATERTHAN:
    case COMPARE_GREATERTHANOREQUALTO:
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_130);
      window_select.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(window_select.
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,2);
      asof_upper.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
      ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = 2;
      pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_01);
      (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])(&result,pEVar14);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar15->orders,(OrderType *)&window_select,(OrderByNullType *)&asof_upper,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &result);
      if (result.ptr != (PhysicalOperator *)0x0) {
        (*(result.ptr)->_vptr_PhysicalOperator[1])();
      }
      Value::Infinity((Value *)&result,&asof_type);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                ((duckdb *)&window_select,(Value *)&result);
      _Var24._M_head_impl =
           (Expression *)
           window_select.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      window_select.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_130);
      break;
    default:
      pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&result,"Invalid ASOF JOIN ordering for WINDOW",
                 (allocator *)&window_select);
      InternalException::InternalException(pIVar18,(string *)&result);
      __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    _Var2._M_head_impl =
         (pBVar15->default_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar15->default_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var24._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    }
    if (window_select.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)&((((window_select.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                     .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl)->
                   super_BaseExpression).type)();
    }
    window_select.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Value::~Value((Value *)&result);
    pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_130);
    pBVar15->start = UNBOUNDED_PRECEDING;
    pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_130);
    pBVar15->end = CURRENT_ROW_ROWS;
    window_select.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    window_select.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    window_select.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundWindowExpression,std::default_delete<duckdb::BoundWindowExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&window_select,
               (unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                *)&local_130);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(this_00,1);
    pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar8);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&pLVar9->types,
               &asof_type);
    pPVar17 = Make<duckdb::PhysicalWindow,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                        (this,&pLVar9->types,&window_select,&rhs_cardinality);
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::emplace_back<duckdb::PhysicalOperator&>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&pPVar17->children,build);
    asof_upper.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    asof_upper.right.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&pvVar12->left);
    (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])(&result,pEVar14);
    uVar4 = asof_upper.left;
    asof_upper.left.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)result;
    result.ptr = (PhysicalOperator *)0x0;
    if ((uVar4.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0) && ((**(code **)(*(long *)uVar4.
                                        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                        .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                        _M_head_impl + 8))(), result.ptr != (PhysicalOperator *)0x0)
       ) {
      (*(result.ptr)->_vptr_PhysicalOperator[1])();
    }
    local_60 = ((long)(pLVar9->types).
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pLVar9->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18 - 1;
    make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType&,unsigned_long>
              ((duckdb *)&result,&asof_type,&local_60);
    uVar4 = asof_upper.right;
    asof_upper.right.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)result;
    result.ptr = (PhysicalOperator *)0x0;
    if ((uVar4.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0) && ((**(code **)(*(long *)uVar4.
                                        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                        .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                        _M_head_impl + 8))(), result.ptr != (PhysicalOperator *)0x0)
       ) {
      (*(result.ptr)->_vptr_PhysicalOperator[1])();
    }
    if (3 < (byte)(pvVar12->comparison - COMPARE_LESSTHAN)) {
      pIVar18 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&result,"Invalid ASOF JOIN comparison for IEJoin",(allocator *)&local_60)
      ;
      InternalException::InternalException(pIVar18,(string *)&result);
      __cxa_throw(pIVar18,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    asof_upper.comparison = 0x39 - pvVar12->comparison;
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
    emplace_back<duckdb::JoinCondition>
              (&this_02->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
               ,&asof_upper);
    pPVar11 = Make<duckdb::PhysicalIEJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,unsigned_long&>
                        (this,op,pPVar11,pPVar17,this_02,
                         &(op->super_LogicalJoin).super_LogicalOperator.field_0x61,&lhs_cardinality)
    ;
    JoinCondition::~JoinCondition(&asof_upper);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&window_select.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             );
    if (local_130._M_head_impl != (BoundWindowExpression *)0x0) {
      (*((local_130._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    LogicalType::~LogicalType(&asof_type);
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&equi_indexes);
  return pPVar11;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::PlanAsOfJoin(LogicalComparisonJoin &op) {
	// now visit the children
	D_ASSERT(op.children.size() == 2);
	idx_t lhs_cardinality = op.children[0]->EstimateCardinality(context);
	idx_t rhs_cardinality = op.children[1]->EstimateCardinality(context);
	auto &left = CreatePlan(*op.children[0]);
	auto &right = CreatePlan(*op.children[1]);

	//	Validate
	vector<idx_t> equi_indexes;
	auto asof_idx = op.conditions.size();
	for (size_t c = 0; c < op.conditions.size(); ++c) {
		auto &cond = op.conditions[c];
		switch (cond.comparison) {
		case ExpressionType::COMPARE_EQUAL:
		case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
			equi_indexes.emplace_back(c);
			break;
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		case ExpressionType::COMPARE_GREATERTHAN:
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		case ExpressionType::COMPARE_LESSTHAN:
			D_ASSERT(asof_idx == op.conditions.size());
			asof_idx = c;
			break;
		default:
			throw InternalException("Invalid ASOF JOIN comparison");
		}
	}
	D_ASSERT(asof_idx < op.conditions.size());

	auto &config = ClientConfig::GetConfig(context);
	if (!config.force_asof_iejoin) {
		if (op.children[0]->has_estimated_cardinality && lhs_cardinality <= config.asof_loop_join_threshold) {
			auto result = PlanAsOfLoopJoin(op, left, right);
			if (result) {
				return *result;
			}
		}
		return Make<PhysicalAsOfJoin>(op, left, right);
	}

	//	Strip extra column from rhs projections
	auto &right_projection_map = op.right_projection_map;
	if (right_projection_map.empty()) {
		const auto right_count = right.GetTypes().size();
		right_projection_map.reserve(right_count);
		for (column_t i = 0; i < right_count; ++i) {
			right_projection_map.emplace_back(i);
		}
	}

	//	Debug implementation: IEJoin of Window
	//	LEAD(asof_column, 1, infinity) OVER (PARTITION BY equi_column... ORDER BY asof_column) AS asof_end
	auto &asof_comp = op.conditions[asof_idx];
	auto &asof_column = asof_comp.right;
	auto asof_type = asof_column->return_type;
	auto asof_end = make_uniq<BoundWindowExpression>(ExpressionType::WINDOW_LEAD, asof_type, nullptr, nullptr);
	asof_end->children.emplace_back(asof_column->Copy());
	// TODO: If infinities are not supported for a type, fake them by looking at LHS statistics?
	asof_end->offset_expr = make_uniq<BoundConstantExpression>(Value::BIGINT(1));
	for (auto equi_idx : equi_indexes) {
		asof_end->partitions.emplace_back(op.conditions[equi_idx].right->Copy());
	}
	switch (asof_comp.comparison) {
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
	case ExpressionType::COMPARE_GREATERTHAN:
		asof_end->orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_FIRST, asof_column->Copy());
		asof_end->default_expr = make_uniq<BoundConstantExpression>(Value::Infinity(asof_type));
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
	case ExpressionType::COMPARE_LESSTHAN:
		asof_end->orders.emplace_back(OrderType::DESCENDING, OrderByNullType::NULLS_FIRST, asof_column->Copy());
		asof_end->default_expr = make_uniq<BoundConstantExpression>(Value::NegativeInfinity(asof_type));
		break;
	default:
		throw InternalException("Invalid ASOF JOIN ordering for WINDOW");
	}

	asof_end->start = WindowBoundary::UNBOUNDED_PRECEDING;
	asof_end->end = WindowBoundary::CURRENT_ROW_ROWS;

	vector<unique_ptr<Expression>> window_select;
	window_select.emplace_back(std::move(asof_end));

	auto &window_types = op.children[1]->types;
	window_types.emplace_back(asof_type);

	auto &window = Make<PhysicalWindow>(window_types, std::move(window_select), rhs_cardinality);
	window.children.emplace_back(right);

	// IEJoin(left, window, conditions || asof_comp ~op asof_end)
	JoinCondition asof_upper;
	asof_upper.left = asof_comp.left->Copy();
	asof_upper.right = make_uniq<BoundReferenceExpression>(asof_type, window_types.size() - 1);
	switch (asof_comp.comparison) {
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		asof_upper.comparison = ExpressionType::COMPARE_LESSTHAN;
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		asof_upper.comparison = ExpressionType::COMPARE_LESSTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		asof_upper.comparison = ExpressionType::COMPARE_GREATERTHAN;
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		asof_upper.comparison = ExpressionType::COMPARE_GREATERTHANOREQUALTO;
		break;
	default:
		throw InternalException("Invalid ASOF JOIN comparison for IEJoin");
	}

	op.conditions.emplace_back(std::move(asof_upper));
	return Make<PhysicalIEJoin>(op, left, window, std::move(op.conditions), op.join_type, lhs_cardinality);
}